

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void ComputeMulticastHash(uchar *MulticastMAC,uint8_t *regAddr,uint16_t *regData)

{
  byte bVar1;
  uint32_t uVar2;
  
  uVar2 = KSZ8851CRC(MulticastMAC,6);
  bVar1 = (byte)(uVar2 >> 0x18);
  *regAddr = bVar1 >> 5 & 6 | 0xa0;
  *regData = (uint16_t)(1 << (bVar1 >> 2 & 0xf));
  return;
}

Assistant:

void ComputeMulticastHash(unsigned char *MulticastMAC, uint8_t &regAddr, uint16_t &regData)
{
    uint32_t crc = KSZ8851CRC(MulticastMAC, 6);
    int regOffset = (crc >> 29) & 0x0006;  // first 2 bits of CRC (x2)
    int regBit = (crc >> 26) & 0x00F;      // next 4 bits of CRC
    regAddr = 0xA0 + regOffset;            // 0xA0 --> MAHTR0 (MAC Address Hash Table Register 0)
    regData = (1 << regBit);
}